

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O3

bool __thiscall IntBounds::IsGreaterThanOrEqualTo(IntBounds *this,int constantBoundBase,int offset)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  
  iVar1 = this->constantLowerBound;
  if (offset == 1) {
    bVar2 = constantBoundBase < iVar1;
  }
  else if (offset == 0) {
    bVar2 = constantBoundBase <= iVar1;
  }
  else {
    iVar3 = offset + constantBoundBase;
    if (offset < 0) {
      bVar2 = constantBoundBase <= iVar3 || iVar3 <= iVar1;
    }
    else {
      bVar2 = constantBoundBase <= iVar3 && iVar3 <= iVar1;
    }
  }
  return bVar2;
}

Assistant:

bool IntBounds::IsGreaterThanOrEqualTo(const int constantBoundBase, const int offset) const
{
    return IsGreaterThanOrEqualTo(constantLowerBound, constantBoundBase, offset);
}